

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O2

bool comparesEqual(QJsonArray *lhs,QJsonArray *rhs)

{
  QCborContainerPrivate *pQVar1;
  QCborContainerPrivate *pQVar2;
  long lVar3;
  bool bVar4;
  ulong idx;
  long in_FS_OFFSET;
  bool bVar5;
  QCborValue local_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (rhs->a).d.ptr;
  pQVar2 = (lhs->a).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar5 = true;
  }
  else {
    if (pQVar2 == (QCborContainerPrivate *)0x0) {
      lVar3 = (pQVar1->elements).d.size;
    }
    else {
      lVar3 = (pQVar2->elements).d.size;
      if (pQVar1 != (QCborContainerPrivate *)0x0) {
        if (lVar3 == (pQVar1->elements).d.size) {
          idx = 0;
          do {
            pQVar1 = (lhs->a).d.ptr;
            bVar5 = (ulong)(pQVar1->elements).d.size <= idx;
            if (bVar5) break;
            QCborContainerPrivate::valueAt(&local_50,pQVar1,idx);
            QCborContainerPrivate::valueAt(&local_68,(rhs->a).d.ptr,idx);
            bVar4 = operator!=(&local_50,&local_68);
            QCborValue::~QCborValue((QCborValue *)&local_68);
            QCborValue::~QCborValue((QCborValue *)&local_50);
            idx = idx + 1;
          } while (!bVar4);
        }
        else {
          bVar5 = false;
        }
        goto LAB_002bf0c9;
      }
    }
    bVar5 = lVar3 == 0;
  }
LAB_002bf0c9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool comparesEqual(const QJsonArray &lhs, const QJsonArray &rhs)
{
    if (lhs.a == rhs.a)
        return true;

    if (!lhs.a)
        return !rhs.a->elements.size();
    if (!rhs.a)
        return !lhs.a->elements.size();
    if (lhs.a->elements.size() != rhs.a->elements.size())
        return false;

    for (qsizetype i = 0; i < lhs.a->elements.size(); ++i) {
        if (lhs.a->valueAt(i) != rhs.a->valueAt(i))
            return false;
    }
    return true;
}